

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semaphore.cpp
# Opt level: O2

SemaphoreStatus ot::os::semaphore::SemaphoreOpen(string *aName,Semaphore *aSem)

{
  sem_t *psVar1;
  string semName;
  
  std::operator+(&semName,"/",aName);
  aSem->mPlatform = (sem_t *)0x0;
  psVar1 = sem_open(semName._M_dataplus._M_p,0x40,0x180,1);
  aSem->mPlatform = (sem_t *)psVar1;
  std::__cxx11::string::~string((string *)&semName);
  return (SemaphoreStatus)(psVar1 == (sem_t *)0x0);
}

Assistant:

SemaphoreStatus SemaphoreOpen(std::string const &aName, Semaphore &aSem)
{
    std::string semName = "/" + aName;
    aSem.mPlatform      = nullptr;

    aSem.mPlatform = sem_open(semName.c_str(), O_CREAT, S_IWUSR | S_IRUSR, 1);
    if (aSem.mPlatform == SEM_FAILED)
    {
        return kError;
    }

    return kSuccess;
}